

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

int cvui::internal::inputUpdateCursor
              (int theWidth,String *theContent,double theFontScale,bool theFocused)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar4 = gLastInputKeyPressed;
  if (gLastInputKeyPressed == -1 || !theFocused) {
    iVar4 = -1;
  }
  else {
    iVar5 = theWidth / (int)(theFontScale * 16.0);
    gLastInputKeyPressed = -1;
    if (iVar4 - 0x20U < 0x5f) {
      iVar3 = (int)theContent->_M_string_length;
      iVar2 = gInput._40_4_ + gInput._32_4_;
      if (iVar3 <= (int)(gInput._40_4_ + gInput._32_4_)) {
        iVar2 = iVar3;
      }
      std::__cxx11::string::insert((ulong)theContent,(long)iVar2,'\x01');
      iVar3 = gInput._40_4_;
      if (iVar5 <= (int)gInput._40_4_) {
        iVar3 = gInput._32_4_;
      }
      *(int *)(gInput + (ulong)((int)gInput._40_4_ < iVar5) * 8 + 0x20) = iVar3 + 1;
    }
    if (iVar4 == 0x270000) {
      if ((ulong)(long)(int)gInput._40_4_ < theContent->_M_string_length) {
        gInput._40_4_ = gInput._40_4_ + 1;
      }
      if (iVar5 < (int)gInput._40_4_) {
        gInput._40_4_ = iVar5;
      }
      iVar4 = 0x270000;
      if ((gInput._40_4_ == iVar5) && (iVar5 <= ~gInput._32_4_ + (int)theContent->_M_string_length))
      {
        gInput._32_4_ = gInput._32_4_ + 1;
        gInput._40_4_ = iVar5 + -1;
      }
    }
    else if (iVar4 == 0x250000) {
      iVar4 = 0x250000;
      bVar1 = (int)gInput._40_4_ < 1;
      gInput._40_4_ = gInput._40_4_ + -1;
      if (bVar1) {
        gInput._40_4_ = 0;
        iVar5 = 1;
        if (1 < (int)gInput._32_4_) {
          iVar5 = gInput._32_4_;
        }
        gInput._32_4_ = iVar5 + -1;
      }
    }
    else if (iVar4 == 8) {
      iVar4 = 8;
      if (0 < (int)gInput._40_4_ && theContent->_M_string_length != 0) {
        std::__cxx11::string::substr((ulong)&local_60,(ulong)theContent);
        std::__cxx11::string::substr((ulong)&local_80,(ulong)theContent);
        std::operator+(&local_40,&local_60,&local_80);
        std::__cxx11::string::operator=((string *)theContent,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        iVar5 = 1;
        if (1 < (int)gInput._40_4_) {
          iVar5 = gInput._40_4_;
        }
        gInput._40_4_ = iVar5 + -1;
      }
    }
    else if ((int)gInput._40_4_ < 0 || iVar4 != 0x2e0000) {
      if (iVar4 == 0x230000) {
        iVar4 = (int)theContent->_M_string_length;
        gInput._40_4_ = iVar5;
        if (iVar4 < iVar5) {
          gInput._40_4_ = iVar4;
        }
        gInput._32_4_ = 0;
        if (0 < iVar4 - iVar5) {
          gInput._32_4_ = iVar4 - iVar5;
        }
        iVar4 = 0x230000;
      }
      else if (iVar4 == 0x240000) {
        gInput._40_4_ = 0;
        gInput._32_4_ = 0;
        iVar4 = 0x240000;
      }
    }
    else {
      iVar4 = 0x2e0000;
      if ((ulong)(uint)gInput._40_4_ < theContent->_M_string_length) {
        std::__cxx11::string::erase((ulong)theContent,(ulong)(uint)gInput._40_4_);
      }
    }
  }
  return iVar4;
}

Assistant:

int inputUpdateCursor(int theWidth, cv::String& theContent, double theFontScale, bool theFocused) {
		if (!theFocused || internal::gLastInputKeyPressed == -1) {
            return -1;
        }

		int key = internal::gLastInputKeyPressed;
        int aScreenCharSize = render::getScreenCharWidth(theFontScale);
        int aCharsFitWidth = (int)(theWidth / aScreenCharSize);

        internal::gLastInputKeyPressed = -1;

		if (key >= 32 && key <= 126) {
            theContent.insert(std::min(gInput.contentStartIndex + gInput.cursorIndex, (int)theContent.length()), 1, (char)key);

            if (gInput.cursorIndex < aCharsFitWidth) {
                gInput.cursorIndex++;
            } else {
                gInput.contentStartIndex++;
            }
        }

		if (key == KEY_BACKSPACE && theContent.length() && gInput.cursorIndex > 0) {
			int indexChatToBeRemoved = gInput.cursorIndex - 1;
			theContent = theContent.substr(0, indexChatToBeRemoved) + theContent.substr(indexChatToBeRemoved + 1, theContent.length());
			
            gInput.cursorIndex--;

            if (gInput.cursorIndex < 0) {
                gInput.cursorIndex = 0;
            }
		} else if (key == KEY_ARROW_RIGHT) {
            if (gInput.cursorIndex < theContent.length()) {
                gInput.cursorIndex++;
            }

            int aRemainingContentChars = (int)theContent.length() - gInput.contentStartIndex - 1;

            if (gInput.cursorIndex > aCharsFitWidth) {
                gInput.cursorIndex = aCharsFitWidth;
            }

            if (gInput.cursorIndex == aCharsFitWidth && aRemainingContentChars >= aCharsFitWidth) {
                gInput.contentStartIndex++;
                gInput.cursorIndex--;
            }
        } else if (key == KEY_ARROW_LEFT) {
            gInput.cursorIndex--;

            if (gInput.cursorIndex < 0) {
                gInput.cursorIndex = 0;
                gInput.contentStartIndex--;
                gInput.contentStartIndex = std::max(gInput.contentStartIndex, 0);
            }
        } else if (key == KEY_DELETE && gInput.cursorIndex >= 0 && gInput.cursorIndex < theContent.length()) {
			theContent.erase(gInput.cursorIndex, 1);

        } else if (key == KEY_HOME) {
            gInput.cursorIndex = 0;
            gInput.contentStartIndex = 0;

        } else if (key == KEY_END) {
            int aContentLength = (int)theContent.length();
            gInput.contentStartIndex = aContentLength - aCharsFitWidth;
            gInput.contentStartIndex = std::max(gInput.contentStartIndex, 0);

            gInput.cursorIndex = aContentLength - gInput.contentStartIndex;
        }

        return key;
    }